

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evolution_test.cpp
# Opt level: O1

void flatbuffers::tests::EvolutionTest(string *tests_data_path)

{
  ulong *puVar1;
  pointer pcVar2;
  void *pvVar3;
  bool bVar4;
  Root expval;
  uchar expval_00;
  char expval_01;
  ushort uVar5;
  long lVar6;
  undefined8 *puVar7;
  long *plVar8;
  uint8_t *__first;
  Root *pRVar9;
  TableC *pTVar10;
  ulong uVar11;
  undefined1 *puVar12;
  long *plVar13;
  Root *this;
  int *piVar14;
  int iVar15;
  undefined8 uVar16;
  string *buf;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> __result;
  string *buf_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string json;
  string schema;
  vector<unsigned_char,_std::allocator<unsigned_char>_> binaries [2];
  string jsonfiles [2];
  string schemas [2];
  IDLOptions idl_opts;
  Parser parser;
  ulong *local_c40;
  long local_c38;
  ulong local_c30;
  undefined8 uStack_c28;
  string local_c20;
  long *local_c00;
  long local_bf8;
  long local_bf0;
  long lStack_be8;
  string local_be0;
  VerifierTemplate<false> local_bc0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b78;
  uint *puStack_b60;
  undefined8 local_b58 [2];
  string local_b48;
  long local_b28 [4];
  string local_b08;
  long local_ae8 [5];
  IDLOptions local_ac0;
  Parser local_7b0;
  
  lVar6 = 0x10;
  do {
    puVar12 = (undefined1 *)((long)&local_b08._M_dataplus._M_p + lVar6);
    *(undefined1 **)((long)local_b28 + lVar6 + 0x10) = puVar12;
    *(undefined8 *)((long)local_b28 + lVar6 + 0x18) = 0;
    *puVar12 = 0;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0x50);
  lVar6 = 0x10;
  do {
    puVar12 = (undefined1 *)((long)&local_b48._M_dataplus._M_p + lVar6);
    *(undefined1 **)((long)local_b58 + lVar6) = puVar12;
    *(undefined8 *)((long)local_b58 + lVar6 + 8) = 0;
    *puVar12 = 0;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0x50);
  local_b58[0] = 0;
  local_b58[1] = 0;
  local_b78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puStack_b60 = (uint *)0x0;
  local_b78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_b78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  IDLOptions::IDLOptions(&local_ac0);
  local_ac0.lang_to_generate._1_1_ = local_ac0.lang_to_generate._1_1_ | 1;
  Parser::Parser(&local_7b0,&local_ac0);
  __result.container = &local_b78;
  iVar15 = 1;
  lVar6 = 0;
  do {
    local_c40 = &local_c30;
    pcVar2 = (tests_data_path->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c40,pcVar2,pcVar2 + tests_data_path->_M_string_length);
    std::__cxx11::string::append((char *)&local_c40);
    NumToString<int>(&local_c20,iVar15);
    uVar11 = 0xf;
    if (local_c40 != &local_c30) {
      uVar11 = local_c30;
    }
    if (uVar11 < local_c20._M_string_length + local_c38) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c20._M_dataplus._M_p != &local_c20.field_2) {
        uVar16 = local_c20.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_c20._M_string_length + local_c38) goto LAB_00158ae1;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c20,0,(char *)0x0,(ulong)local_c40);
    }
    else {
LAB_00158ae1:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_c40,(ulong)local_c20._M_dataplus._M_p)
      ;
    }
    local_c00 = &local_bf0;
    plVar8 = puVar7 + 2;
    if ((long *)*puVar7 == plVar8) {
      local_bf0 = *plVar8;
      lStack_be8 = puVar7[3];
    }
    else {
      local_bf0 = *plVar8;
      local_c00 = (long *)*puVar7;
    }
    local_bf8 = puVar7[1];
    *puVar7 = plVar8;
    puVar7[1] = 0;
    *(undefined1 *)plVar8 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_c00);
    local_bc0.buf_ = (uint8_t *)&local_bc0.opts_;
    plVar13 = plVar8 + 2;
    if ((Options *)*plVar8 == (Options *)plVar13) {
      local_bc0.opts_._0_8_ = *plVar13;
      local_bc0.opts_._8_8_ = plVar8[3];
    }
    else {
      local_bc0.opts_._0_8_ = *plVar13;
      local_bc0.buf_ = (uint8_t *)*plVar8;
    }
    local_bc0.size_ = plVar8[1];
    *plVar8 = (long)plVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if (local_c00 != &local_bf0) {
      operator_delete(local_c00,local_bf0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c20._M_dataplus._M_p != &local_c20.field_2) {
      operator_delete(local_c20._M_dataplus._M_p,local_c20.field_2._M_allocated_capacity + 1);
    }
    if (local_c40 != &local_c30) {
      operator_delete(local_c40,local_c30 + 1);
    }
    buf_00 = (string *)((long)&local_b08._M_dataplus._M_p + lVar6);
    bVar4 = LoadFile((char *)local_bc0.buf_,false,buf_00);
    TestEq<bool,bool>(true,bVar4,
                      "\'true\' != \'flatbuffers::LoadFile(schema.c_str(), false, &schemas[i])\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                      ,0x1b,"");
    local_c20._M_dataplus._M_p = (pointer)&local_c20.field_2;
    pcVar2 = (tests_data_path->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c20,pcVar2,pcVar2 + tests_data_path->_M_string_length);
    std::__cxx11::string::append((char *)&local_c20);
    NumToString<int>(&local_be0,iVar15);
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c20._M_dataplus._M_p != &local_c20.field_2) {
      uVar16 = local_c20.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_be0._M_string_length + local_c20._M_string_length) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_be0._M_dataplus._M_p != &local_be0.field_2) {
        uVar16 = local_be0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_be0._M_string_length + local_c20._M_string_length)
      goto LAB_00158cca;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_be0,0,(char *)0x0,(ulong)local_c20._M_dataplus._M_p);
    }
    else {
LAB_00158cca:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_c20,(ulong)local_be0._M_dataplus._M_p)
      ;
    }
    local_c40 = &local_c30;
    puVar1 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar1) {
      local_c30 = *puVar1;
      uStack_c28 = puVar7[3];
    }
    else {
      local_c30 = *puVar1;
      local_c40 = (ulong *)*puVar7;
    }
    local_c38 = puVar7[1];
    *puVar7 = puVar1;
    puVar7[1] = 0;
    *(undefined1 *)puVar1 = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_c40);
    local_c00 = &local_bf0;
    plVar13 = plVar8 + 2;
    if ((long *)*plVar8 == plVar13) {
      local_bf0 = *plVar13;
      lStack_be8 = plVar8[3];
    }
    else {
      local_bf0 = *plVar13;
      local_c00 = (long *)*plVar8;
    }
    local_bf8 = plVar8[1];
    *plVar8 = (long)plVar13;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if (local_c40 != &local_c30) {
      operator_delete(local_c40,local_c30 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_be0._M_dataplus._M_p != &local_be0.field_2) {
      operator_delete(local_be0._M_dataplus._M_p,local_be0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c20._M_dataplus._M_p != &local_c20.field_2) {
      operator_delete(local_c20._M_dataplus._M_p,local_c20.field_2._M_allocated_capacity + 1);
    }
    buf = (string *)((long)&local_b48._M_dataplus._M_p + lVar6);
    bVar4 = LoadFile((char *)local_c00,false,buf);
    TestEq<bool,bool>(true,bVar4,
                      "\'true\' != \'flatbuffers::LoadFile(json.c_str(), false, &jsonfiles[i])\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                      ,0x1e,"");
    bVar4 = Parser::Parse(&local_7b0,(buf_00->_M_dataplus)._M_p,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(true,bVar4,"\'true\' != \'parser.Parse(schemas[i].c_str())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                      ,0x20,"");
    bVar4 = Parser::Parse(&local_7b0,(buf->_M_dataplus)._M_p,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(true,bVar4,"\'true\' != \'parser.Parse(jsonfiles[i].c_str())\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                      ,0x21,"");
    uVar11 = (ulong)local_7b0.builder_.buf_.size_;
    __first = FlatBufferBuilderImpl<false>::GetBufferPointer(&local_7b0.builder_);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(__result.container,uVar11);
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<unsigned_char*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (__first,__first + uVar11,__result);
    if (local_c00 != &local_bf0) {
      operator_delete(local_c00,local_bf0 + 1);
    }
    if ((Options *)local_bc0.buf_ != &local_bc0.opts_) {
      operator_delete(local_bc0.buf_,local_bc0.opts_._0_8_ + 1);
    }
    lVar6 = lVar6 + 0x20;
    __result.container = __result.container + 1;
    iVar15 = iVar15 + 1;
    if (lVar6 != 0x20) {
      lVar6 = 8;
      do {
        local_bc0.buf_ = *(uint8_t **)((long)&local_bc0.flex_reuse_tracker_ + lVar6);
        local_bc0.size_ =
             *(long *)((long)&local_b78.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar6) -
             (long)local_bc0.buf_;
        local_bc0.opts_.max_depth = 0x40;
        local_bc0.opts_.max_tables = 1000000;
        local_bc0.opts_._8_2_ = 0x101;
        local_bc0.opts_.max_size = 0x7fffffff;
        local_bc0.opts_.assert = false;
        local_bc0.upper_bound_ = 0;
        local_bc0.depth_ = 0;
        local_bc0.num_tables_ = 0;
        local_bc0.flex_reuse_tracker_ = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0
        ;
        if (0x7ffffffe < local_bc0.size_) {
          __assert_fail("size_ < opts.max_size",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/verifier.h"
                        ,0x2f,
                        "flatbuffers::VerifierTemplate<false>::VerifierTemplate(const uint8_t *const, const size_t, const Options &) [TrackVerifierBufferSize = false]"
                       );
        }
        bVar4 = VerifierTemplate<false>::VerifyBufferFromStart<Evolution::V1::Root>
                          (&local_bc0,(char *)0x0,0);
        TestEq<bool,bool>(true,bVar4,"\'true\' != \'Evolution::V1::VerifyRootBuffer(verifier)\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                          ,0x2d,"");
        bVar4 = VerifierTemplate<false>::VerifyBufferFromStart<Evolution::V2::Root>
                          (&local_bc0,(char *)0x0,0);
        TestEq<bool,bool>(true,bVar4,"\'true\' != \'Evolution::V2::VerifyRootBuffer(verifier)\'",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                          ,0x2e,"");
        lVar6 = lVar6 + 0x18;
      } while (lVar6 == 0x20);
      if ((uint *)local_b78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start == (uint *)0x0) {
        this = (Root *)0x0;
      }
      else {
        this = (Root *)((ulong)*(uint *)local_b78.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                       (long)local_b78.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
      }
      bVar4 = true;
      if (0x1c < *(ushort *)(this + -(long)*(int *)this)) {
        bVar4 = *(short *)(this + (0x1c - (long)*(int *)this)) == 0;
      }
      TestEq<bool,bool>(true,bVar4,"\'true\' != \'nullptr == root_v1_viewed_from_v2->k()\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                        ,0x34,"");
      if (*(ushort *)(this + -(long)*(int *)this) < 0x1f) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(ushort *)(this + (0x1e - (long)*(int *)this));
      }
      if (uVar5 == 0) {
        expval.super_Table = (Table)0x38;
      }
      else {
        expval.super_Table = this[uVar5].super_Table;
      }
      TestEq<unsigned_char,int>
                ((uchar)expval.super_Table,0x38,"\'root_v1_viewed_from_v2->l()\' != \'56\'",
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                 ,0x36,"");
      if (*(ushort *)(this + -(long)*(int *)this) < 0xf) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(ushort *)(this + (0xe - (long)*(int *)this));
      }
      if (uVar5 == 0) {
        pRVar9 = (Root *)0x0;
      }
      else {
        pRVar9 = this + (ulong)*(uint *)(this + uVar5) + (ulong)uVar5;
      }
      bVar4 = true;
      if (8 < *(ushort *)(pRVar9 + -(long)*(int *)pRVar9)) {
        bVar4 = *(short *)(pRVar9 + (8 - (long)*(int *)pRVar9)) == 0;
      }
      TestEq<bool,bool>(true,bVar4,"\'true\' != \'nullptr == root_v1_viewed_from_v2->e()->c()\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                        ,0x38,"");
      pTVar10 = Evolution::V2::Root::c_as_TableC(this);
      TestEq<bool,bool>(true,pTVar10 == (TableC *)0x0,
                        "\'true\' != \'nullptr == root_v1_viewed_from_v2->c_as_TableC()\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                        ,0x3a,"");
      if (*(ushort *)(this + -(long)*(int *)this) < 9) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(ushort *)(this + (8 - (long)*(int *)this));
      }
      if (uVar5 == 0) {
        bVar4 = false;
      }
      else {
        bVar4 = this[uVar5].super_Table == (Table)0x2;
      }
      TestEq<bool,bool>(true,bVar4,
                        "\'true\' != \'root_v1_viewed_from_v2->c_type() == Evolution::V2::Union::TableB\'"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                        ,0x3c,"");
      if (*(ushort *)(this + -(long)*(int *)this) < 0x11) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)*(ushort *)(this + (0x10 - (long)*(int *)this));
      }
      TestEq<int,int>(*(int *)(this + uVar11),0x10,"\'root_v1_viewed_from_v2->ff()->a()\' != \'16\'"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                      ,0x3f,"");
      if (puStack_b60 == (uint *)0x0) {
        piVar14 = (int *)0x0;
      }
      else {
        piVar14 = (int *)((ulong)*puStack_b60 + (long)puStack_b60);
      }
      if (*(ushort *)((long)piVar14 - (long)*piVar14) < 9) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(ushort *)((long)piVar14 + (8 - (long)*piVar14));
      }
      if (uVar5 == 0) {
        expval_00 = '\0';
      }
      else {
        expval_00 = *(uchar *)((long)piVar14 + (ulong)uVar5);
      }
      TestEq<unsigned_char,int>
                (expval_00,3,"\'static_cast<uint8_t>(root_v2_viewed_from_v1->c_type())\' != \'3\'",
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                 ,0x45,"");
      if (*(ushort *)((long)piVar14 - (long)*piVar14) < 0xb) {
        bVar4 = false;
      }
      else {
        bVar4 = *(short *)((long)piVar14 + (10 - (long)*piVar14)) != 0;
      }
      TestEq<bool,bool>(true,bVar4,"\'nullptr\' == \'root_v2_viewed_from_v1->c()\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                        ,0x46,"");
      if (*(ushort *)((long)piVar14 - (long)*piVar14) < 0xd) {
        uVar5 = 0;
      }
      else {
        uVar5 = *(ushort *)((long)piVar14 + (0xc - (long)*piVar14));
      }
      if (uVar5 == 0) {
        expval_01 = '\0';
      }
      else {
        expval_01 = *(char *)((long)piVar14 + (ulong)uVar5);
      }
      TestEq<signed_char,int>
                (expval_01,3,"\'static_cast<int8_t>(root_v2_viewed_from_v1->d())\' != \'3\'",
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                 ,0x49,"");
      iVar15 = 0;
      uVar5 = 0;
      if (4 < *(ushort *)((long)piVar14 - (long)*piVar14)) {
        uVar5 = *(ushort *)((long)piVar14 + (4 - (long)*piVar14));
      }
      if (uVar5 != 0) {
        iVar15 = *(int *)((long)piVar14 + (ulong)uVar5);
      }
      TestEq<int,int>(iVar15,0,"\'root_v2_viewed_from_v1->a()\' != \'0\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                      ,0x4c,"");
      if (*(ushort *)((long)piVar14 - (long)*piVar14) < 0x11) {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)*(ushort *)((long)piVar14 + (0x10 - (long)*piVar14));
      }
      TestEq<int,int>(*(int *)((long)piVar14 + uVar11),0x23,
                      "\'root_v2_viewed_from_v1->f()->a()\' != \'35\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/evolution_test.cpp"
                      ,0x4f,"");
      Parser::~Parser(&local_7b0);
      IDLOptions::~IDLOptions(&local_ac0);
      lVar6 = 0x30;
      do {
        pvVar3 = *(void **)((long)&local_bc0.upper_bound_ + lVar6);
        if (pvVar3 != (void *)0x0) {
          operator_delete(pvVar3,*(long *)((long)&local_bc0.flex_reuse_tracker_ + lVar6) -
                                 (long)pvVar3);
        }
        lVar6 = lVar6 + -0x18;
      } while (lVar6 != 0);
      lVar6 = -0x40;
      plVar8 = local_b28 + 2;
      do {
        if (plVar8 != (long *)plVar8[-2]) {
          operator_delete((long *)plVar8[-2],*plVar8 + 1);
        }
        plVar8 = plVar8 + -4;
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0);
      lVar6 = -0x40;
      plVar8 = local_ae8 + 2;
      do {
        if (plVar8 != (long *)plVar8[-2]) {
          operator_delete((long *)plVar8[-2],*plVar8 + 1);
        }
        plVar8 = plVar8 + -4;
        lVar6 = lVar6 + 0x20;
      } while (lVar6 != 0);
      return;
    }
  } while( true );
}

Assistant:

void EvolutionTest(const std::string &tests_data_path) {
  // VS10 does not support typed enums, exclude from tests
#if !defined(_MSC_VER) || _MSC_VER >= 1700
  const int NUM_VERSIONS = 2;
  std::string schemas[NUM_VERSIONS];
  std::string jsonfiles[NUM_VERSIONS];
  std::vector<uint8_t> binaries[NUM_VERSIONS];

  flatbuffers::IDLOptions idl_opts;
  idl_opts.lang_to_generate |= flatbuffers::IDLOptions::kBinary;
  flatbuffers::Parser parser(idl_opts);

  // Load all the schema versions and their associated data.
  for (int i = 0; i < NUM_VERSIONS; ++i) {
    std::string schema = tests_data_path + "evolution_test/evolution_v" +
                         flatbuffers::NumToString(i + 1) + ".fbs";
    TEST_ASSERT(flatbuffers::LoadFile(schema.c_str(), false, &schemas[i]));
    std::string json = tests_data_path + "evolution_test/evolution_v" +
                       flatbuffers::NumToString(i + 1) + ".json";
    TEST_ASSERT(flatbuffers::LoadFile(json.c_str(), false, &jsonfiles[i]));

    TEST_ASSERT(parser.Parse(schemas[i].c_str()));
    TEST_ASSERT(parser.Parse(jsonfiles[i].c_str()));

    auto bufLen = parser.builder_.GetSize();
    auto buf = parser.builder_.GetBufferPointer();
    binaries[i].reserve(bufLen);
    std::copy(buf, buf + bufLen, std::back_inserter(binaries[i]));
  }

  // Assert that all the verifiers for the different schema versions properly
  // verify any version data.
  for (int i = 0; i < NUM_VERSIONS; ++i) {
    flatbuffers::Verifier verifier(&binaries[i].front(), binaries[i].size());
    TEST_ASSERT(Evolution::V1::VerifyRootBuffer(verifier));
    TEST_ASSERT(Evolution::V2::VerifyRootBuffer(verifier));
  }

  // Test backwards compatibility by reading old data with an evolved schema.
  auto root_v1_viewed_from_v2 = Evolution::V2::GetRoot(&binaries[0].front());
  // field 'k' is new in version 2, so it should be null.
  TEST_ASSERT(nullptr == root_v1_viewed_from_v2->k());
  // field 'l' is new in version 2 with a default of 56.
  TEST_EQ(root_v1_viewed_from_v2->l(), 56);
  // field 'c' of 'TableA' is new in version 2, so it should be null.
  TEST_ASSERT(nullptr == root_v1_viewed_from_v2->e()->c());
  // 'TableC' was added to field 'c' union in version 2, so it should be null.
  TEST_ASSERT(nullptr == root_v1_viewed_from_v2->c_as_TableC());
  // The field 'c' union should be of type 'TableB' regardless of schema version
  TEST_ASSERT(root_v1_viewed_from_v2->c_type() == Evolution::V2::Union::TableB);
  // The field 'f' was renamed to 'ff' in version 2, it should still be
  // readable.
  TEST_EQ(root_v1_viewed_from_v2->ff()->a(), 16);

  // Test forwards compatibility by reading new data with an old schema.
  auto root_v2_viewed_from_v1 = Evolution::V1::GetRoot(&binaries[1].front());
  // The field 'c' union in version 2 is a new table (index = 3) and should
  // still be accessible, but not interpretable.
  TEST_EQ(static_cast<uint8_t>(root_v2_viewed_from_v1->c_type()), 3);
  TEST_NOTNULL(root_v2_viewed_from_v1->c());
  // The field 'd' enum in verison 2 has new members and should still be
  // accessible, but not interpretable.
  TEST_EQ(static_cast<int8_t>(root_v2_viewed_from_v1->d()), 3);
  // The field 'a' in version 2 is deprecated and should return the default
  // value (0) instead of the value stored in the in the buffer (42).
  TEST_EQ(root_v2_viewed_from_v1->a(), 0);
  // The field 'ff' was originally named 'f' in version 1, it should still be
  // readable.
  TEST_EQ(root_v2_viewed_from_v1->f()->a(), 35);
#endif
}